

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

uint32_t peparse::calculateRichChecksum(bounded_buffer *b,pe_header *p)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint8_t i;
  long lVar4;
  pointer prVar5;
  uint uVar6;
  
  lVar4 = 0;
  iVar3 = 0;
  do {
    if (((uint)lVar4 & 0x7c) != 0x3c) {
      bVar2 = (byte)lVar4 & 0x1f;
      iVar3 = iVar3 + ((uint)b->buf[lVar4] << bVar2 | (uint)(b->buf[lVar4] >> 0x20 - bVar2));
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x80);
  for (prVar5 = (p->rich).Entries.
                super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      prVar5 != (p->rich).Entries.
                super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>.
                _M_impl.super__Vector_impl_data._M_finish; prVar5 = prVar5 + 1) {
    iVar1._0_2_ = prVar5->ProductId;
    iVar1._2_2_ = prVar5->BuildNumber;
    uVar6 = iVar1 << 0x10 | (uint)prVar5->BuildNumber;
    bVar2 = (byte)prVar5->Count & 0x1f;
    iVar3 = iVar3 + (uVar6 << bVar2 | uVar6 >> 0x20 - bVar2);
  }
  return iVar3 + 0x80;
}

Assistant:

std::uint32_t calculateRichChecksum(const bounded_buffer *b, pe_header &p) {

  // First, calculate the sum of the DOS header bytes each rotated left the
  // number of times their position relative to the start of the DOS header e.g.
  // second byte is rotated left 2x using rol operation
  std::uint32_t checksum = 0;

  for (uint8_t i = 0; i < RICH_OFFSET; i++) {

    // skip over dos e_lfanew field at offset 0x3C
    if (i >= 0x3C && i <= 0x3F) {
      continue;
    }
    checksum += rol(b->buf[i], i & 0x1F);
  }

  // Next, take summation of each Rich header entry by combining its ProductId
  // and BuildNumber into a single 32 bit number and rotating by its count.
  for (rich_entry entry : p.rich.Entries) {
    std::uint32_t num =
        static_cast<std::uint32_t>((entry.ProductId << 16) | entry.BuildNumber);
    checksum += rol(num, entry.Count & 0x1F);
  }

  checksum += RICH_OFFSET;

  return checksum;
}